

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   (string *__return_storage_ptr__,string_view prefix,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *rng,string_view suffix,string_view sep)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view separator;
  string local_c8;
  string local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_type local_78;
  pointer local_70;
  size_t local_68;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *local_30;
  
  local_88._M_str = prefix._M_str;
  local_88._M_len = prefix._M_len;
  if ((rng->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_48 = sep._M_len;
    pcStack_40 = sep._M_str;
    views._M_len = 3;
    views._M_array = &local_58;
    local_58._M_len = suffix._M_len;
    local_58._M_str = suffix._M_str;
    local_38 = local_88._M_len;
    local_30 = local_88._M_str;
    cmCatViews_abi_cxx11_(&local_a8,views);
    separator._M_str = local_a8._M_dataplus._M_p;
    separator._M_len = local_a8._M_string_length;
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_c8,rng,separator);
    local_78 = local_c8._M_string_length;
    local_70 = local_c8._M_dataplus._M_p;
    views_00._M_len = 3;
    views_00._M_array = &local_88;
    local_68 = suffix._M_len;
    local_60 = suffix._M_str;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(cm::string_view prefix, Range const& rng,
                   cm::string_view suffix, cm::string_view sep)
{
  if (rng.empty()) {
    return std::string();
  }
  return cmCatViews(
    { prefix, cmJoin(rng, cmCatViews({ suffix, sep, prefix })), suffix });
}